

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_controller.cpp
# Opt level: O3

void __thiscall r_exec::AntiPGMController::push_new_signaling_job(AntiPGMController *this)

{
  View *v;
  int iVar1;
  Group *this_00;
  _Mem *this_01;
  TimeJob *j;
  long lVar2;
  uint64_t uVar3;
  float fVar4;
  float fVar5;
  
  this_00 = r_exec::View::get_host
                      ((View *)(this->super__PGMController).super_OController.super_Controller.view)
  ;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_hostMutex);
  if (iVar1 == 0) {
    fVar4 = r_exec::View::get_act
                      ((View *)(this->super__PGMController).super_OController.super_Controller.view)
    ;
    fVar5 = Group::get_act_thr(this_00);
    if (fVar5 < fVar4) {
      fVar4 = Group::get_c_act(this_00);
      fVar5 = Group::get_c_act_thr(this_00);
      if (fVar5 < fVar4) {
        fVar4 = Group::get_c_sln(this_00);
        fVar5 = Group::get_c_sln_thr(this_00);
        if (fVar5 < fVar4) {
          this_01 = (_Mem *)r_code::Mem::Get();
          j = (TimeJob *)operator_new(0x28);
          v = (View *)(this->super__PGMController).super_OController.super_Controller.view;
          lVar2 = (*Now)();
          uVar3 = r_code::Utils::GetTimestamp<r_code::Code>
                            ((Code *)(((this->super__PGMController).super_OController.
                                       super_Controller.view)->object).object,4);
          AntiPGMSignalingJob::AntiPGMSignalingJob((AntiPGMSignalingJob *)j,v,uVar3 + lVar2);
          _Mem::pushTimeJob(this_01,j);
        }
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_hostMutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void AntiPGMController::push_new_signaling_job()
{
    Group *host = getView()->get_host();
    std::lock_guard<std::mutex> guard(m_hostMutex);

    if (getView()->get_act() > host->get_act_thr() && // active ipgm.
        host->get_c_act() > host->get_c_act_thr() && // c-active group.
        host->get_c_sln() > host->get_c_sln_thr()) { // c-salient group.
        _Mem::Get()->pushTimeJob(new AntiPGMSignalingJob((r_exec::View*)view, Now() + Utils::GetTimestamp<Code>(getObject(), IPGM_TSC)));
    }
}